

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O3

BEGIN_HANDLE begin_clone(BEGIN_HANDLE value)

{
  BEGIN_HANDLE __ptr;
  AMQP_VALUE pAVar1;
  
  __ptr = (BEGIN_HANDLE)malloc(8);
  if (__ptr != (BEGIN_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    __ptr->composite_value = pAVar1;
    if (pAVar1 != (AMQP_VALUE)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (BEGIN_HANDLE)0x0;
}

Assistant:

BEGIN_HANDLE begin_clone(BEGIN_HANDLE value)
{
    BEGIN_INSTANCE* begin_instance = (BEGIN_INSTANCE*)malloc(sizeof(BEGIN_INSTANCE));
    if (begin_instance != NULL)
    {
        begin_instance->composite_value = amqpvalue_clone(((BEGIN_INSTANCE*)value)->composite_value);
        if (begin_instance->composite_value == NULL)
        {
            free(begin_instance);
            begin_instance = NULL;
        }
    }

    return begin_instance;
}